

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

ostream * Minisat::operator<<(ostream *out,Clause *cls)

{
  int iVar1;
  ostream *poVar2;
  Clause *in_RSI;
  ostream *in_RDI;
  ostream *unaff_retaddr;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = Clause::size(in_RSI);
    if (iVar1 <= local_14) break;
    Clause::operator[](in_RSI,local_14);
    poVar2 = operator<<(unaff_retaddr,(Lit *)in_RDI);
    std::operator<<(poVar2," ");
    local_14 = local_14 + 1;
  }
  return in_RDI;
}

Assistant:

inline std::ostream &operator<<(std::ostream &out, const Clause &cls)
{
    for (int i = 0; i < cls.size(); ++i) {
        out << cls[i] << " ";
    }

    return out;
}